

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  PropertiesMap *this_00;
  const_iterator __position;
  cmCTest *pcVar1;
  pointer pbVar2;
  cmCTestMultiProcessHandler *this_01;
  mapped_type *ppcVar3;
  size_t sVar4;
  ostream *poVar5;
  mapped_type_conflict1 *pmVar6;
  cmCTestRunTest *pcVar7;
  iterator iVar8;
  char *__rhs;
  bool bVar9;
  string *f;
  pointer __k;
  bool bVar10;
  int test_local;
  cmCTestRunTest *local_218;
  cmCTestMultiProcessHandler *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  cmWorkingDirectory workdir;
  
  test_local = test;
  if (this->HaveAffinity != 0) {
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    if ((*ppcVar3)->WantAffinity == true) {
      sVar4 = GetProcessorsUsed(this,test_local);
      if ((this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar4) {
        return false;
      }
      workdir.OldDir._M_dataplus._M_p = (pointer)0x0;
      workdir.OldDir._M_string_length = 0;
      workdir.OldDir.field_2._M_allocated_capacity = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&workdir,sVar4);
      while (bVar10 = sVar4 != 0, sVar4 = sVar4 - 1, bVar10) {
        __position._M_node =
             (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&workdir,
                   (value_type_conflict3 *)(__position._M_node + 1));
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&this->ProcessorsAvailable,__position);
      }
      ppcVar3 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&test_local);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (&(*ppcVar3)->Affinity,&workdir);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&workdir);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&workdir);
  poVar5 = std::operator<<((ostream *)&workdir,"test ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,test_local);
  std::operator<<(poVar5,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x9c,local_208._M_dataplus._M_p,this->Quiet);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&workdir);
  pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&test_local);
  *pmVar6 = true;
  EraseTest(this,test_local);
  sVar4 = GetProcessorsUsed(this,test_local);
  this->RunningCount = this->RunningCount + sVar4;
  pcVar7 = (cmCTestRunTest *)operator_new(0x228);
  cmCTestRunTest::cmCTestRunTest(pcVar7,this);
  pcVar1 = this->CTest;
  if (pcVar1->RepeatUntilFail == true) {
    pcVar7->RunUntilFail = true;
    pcVar7->NumberOfRunsLeft = pcVar1->RepeatTests;
  }
  pcVar7->Index = test_local;
  this_00 = &this->Properties;
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&test_local);
  pcVar7->TestProperties = *ppcVar3;
  pbVar2 = (this->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_218 = pcVar7;
  local_210 = this;
  for (__k = (this->Failed->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; this_01 = local_210, __k != pbVar2;
      __k = __k + 1) {
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_00->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&((*ppcVar3)->RequireSuccessDepends)._M_t,__k);
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_00->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    if ((_Rb_tree_header *)iVar8._M_node !=
        &((*ppcVar3)->RequireSuccessDepends)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&pcVar7->FailedDependencies,__k);
    }
  }
  LockResources(local_210,test_local);
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&test_local);
  cmWorkingDirectory::cmWorkingDirectory(&workdir,&(*ppcVar3)->Directory);
  pcVar7 = local_218;
  if (workdir.ResultCode == 0) {
    bVar10 = cmCTestRunTest::StartTest(local_218,this_01->Completed,this_01->Total);
    bVar9 = true;
    if (bVar10) goto LAB_001a936f;
  }
  else {
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_00->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    pcVar7 = local_218;
    std::operator+(&local_1e8,"Failed to change working directory to ",&(*ppcVar3)->Directory);
    std::operator+(&local_1c8,&local_1e8," : ");
    __rhs = strerror(workdir.ResultCode);
    std::operator+(&local_208,&local_1c8,__rhs);
    cmCTestRunTest::StartFailure(pcVar7,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  bVar9 = false;
  FinishTestProcess(this_01,pcVar7,false);
LAB_001a936f:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return bVar9;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += GetProcessorsUsed(test);

  cmCTestRunTest* testRun = new cmCTestRunTest(*this);
  if (this->CTest->GetRepeatUntilFail()) {
    testRun->SetRunUntilFailOn();
    testRun->SetNumberOfRuns(this->CTest->GetTestRepeat());
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (this->Properties[test]->RequireSuccessDepends.find(f) !=
        this->Properties[test]->RequireSuccessDepends.end()) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    testRun->StartFailure("Failed to change working directory to " +
                          this->Properties[test]->Directory + " : " +
                          std::strerror(workdir.GetLastResult()));
  } else {
    if (testRun->StartTest(this->Completed, this->Total)) {
      return true;
    }
  }

  this->FinishTestProcess(testRun, false);
  return false;
}